

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<false> * __thiscall
DecisionServiceState<false>::Key
          (DecisionServiceState<false> *this,Context<false> *ctx,char *str,SizeType length,
          bool param_5)

{
  char cVar1;
  int iVar2;
  BaseState<false> *pBVar3;
  uint in_ECX;
  char *in_RDX;
  long in_RSI;
  Context<false> *in_RDI;
  Context<false> *pCVar4;
  DefaultState<false> *in_stack_fffffffffffffff8;
  
  pCVar4 = in_RDI;
  if (in_ECX == 1) {
    cVar1 = *in_RDX;
    if (cVar1 == 'a') {
      *(char **)(in_RSI + 0x188) = in_RDI->key + 0x20;
      return (BaseState<false> *)(in_RSI + 0x178);
    }
    if (cVar1 == 'c') {
      *(char **)(in_RSI + 0x10) = " ";
      *(undefined4 *)(in_RSI + 0x18) = 1;
      return (BaseState<false> *)(in_RSI + 0x78);
    }
    if (cVar1 == 'p') {
      *(char **)(in_RSI + 0x170) = in_RDI->key + 0x38;
      return (BaseState<false> *)(in_RSI + 0x160);
    }
  }
  else {
    if ((in_ECX == 5) && (iVar2 = strcmp(in_RDX,"pdrop"), iVar2 == 0)) {
      *(char **)(in_RSI + 0x1b8) = in_RDI->key + 0x50;
      return (BaseState<false> *)(in_RSI + 0x1a8);
    }
    if ((in_ECX == 7) && (iVar2 = strcmp(in_RDX,"EventId"), iVar2 == 0)) {
      *(char **)(in_RSI + 0x1a0) = in_RDI->key;
      return (BaseState<false> *)(in_RSI + 400);
    }
    if ((in_ECX != 0) && (*in_RDX == '_')) {
      if ((in_ECX < 6) || (iVar2 = strncmp(in_RDX,"_label",6), iVar2 != 0)) {
        if ((in_ECX == 10) && (iVar2 = strncmp(in_RDX,"_skipLearn",10), iVar2 == 0)) {
          *(char **)(in_RSI + 0x1d0) = in_RDI->key + 0x54;
          return (BaseState<false> *)(in_RSI + 0x1c0);
        }
      }
      else {
        *(char **)(in_RSI + 0x10) = in_RDX;
        *(uint *)(in_RSI + 0x18) = in_ECX;
        if ((6 < in_ECX) && (*(char *)(*(long *)(in_RSI + 0x10) + 6) == '_')) {
          return (BaseState<false> *)(in_RSI + 200);
        }
        if (in_ECX == 6) {
          return (BaseState<false> *)(in_RSI + 0x88);
        }
        if ((in_ECX == 0xb) && (iVar2 = strcasecmp(in_RDX,"_labelIndex"), iVar2 == 0)) {
          return (BaseState<false> *)(in_RSI + 0xd8);
        }
      }
    }
  }
  pBVar3 = DefaultState<false>::Ignore
                     (in_stack_fffffffffffffff8,pCVar4,(SizeType)((ulong)in_RSI >> 0x20));
  return pBVar3;
}

Assistant:

BaseState<audit>* Key(Context<audit>& ctx, const char* str, rapidjson::SizeType length, bool /* copy */)
  {
    if (length == 1)
    {
      switch (str[0])
      {
        case 'a':
          ctx.array_uint_state.output_array = &data->actions;
          return &ctx.array_uint_state;
        case 'p':
          ctx.array_float_state.output_array = &data->probabilities;
          return &ctx.array_float_state;
        case 'c':
          ctx.key = " ";
          ctx.key_length = 1;
          return &ctx.default_state;
      }
    }
    else if (length == 5 && !strcmp(str, "pdrop"))
    {
      ctx.float_state.output_float = &data->probabilityOfDrop;
      return &ctx.float_state;
    }
    else if (length == 7 && !strcmp(str, "EventId"))
    {
      ctx.string_state.output_string = &data->eventId;
      return &ctx.string_state;
    }
    else if (length > 0 && str[0] == '_')
    {
      // match _label*
      if (length >= 6 && !strncmp(str, "_label", 6))
      {
        ctx.key = str;
        ctx.key_length = length;
        if (length >= 7 && ctx.key[6] == '_')
          return &ctx.label_single_property_state;
        else if (length == 6)
          return &ctx.label_state;
        else if (length == 11 && !_stricmp(str, "_labelIndex"))
          return &ctx.label_index_state;
      }
      else if (length == 10 && !strncmp(str, "_skipLearn", 10))
      {
        ctx.bool_state.output_bool = &data->skipLearn;
        return &ctx.bool_state;
      }
    }

    // ignore unknown properties
    return ctx.default_state.Ignore(ctx, length);
  }